

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vsencoding.h
# Opt level: O3

void vsencoding::__vseblocks_unpack12(uint32_t *out,uint32_t *in,uint32_t bs)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  uint uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  
  if (0x1f < bs + 0x1f) {
    auVar4 = vpmovsxbd_avx(ZEXT416(0x4101c08));
    auVar6._8_4_ = 0xfff;
    auVar6._0_8_ = 0xfff00000fff;
    auVar6._12_4_ = 0xfff;
    uVar5 = bs + 0x1f >> 5;
    do {
      uVar3 = *(ulong *)in;
      uVar1 = *(uint *)((long)in + 0x2c);
      *out = (uint)(uVar3 >> 0x14) & 0xfff;
      auVar7._8_8_ = 0;
      auVar7._0_8_ = uVar3;
      auVar7 = vpshufd_avx(auVar7,0x54);
      auVar9 = vpsrlvd_avx2(auVar7,auVar4);
      auVar8 = vpinsrd_avx(auVar6,((uint)uVar3 & 0xff) << 4,1);
      uVar2 = (uint)*(ulong *)((long)in + 8);
      auVar7 = vpand_avx(auVar9,auVar6);
      auVar8 = vpor_avx(auVar9,auVar8);
      auVar7 = vpblendd_avx2(auVar7,auVar8,2);
      *(undefined1 (*) [16])(out + 1) = auVar7;
      out[5] = ((uint)(uVar3 >> 0x20) & 0xf) << 8 | uVar2 >> 0x18;
      out[6] = uVar2 >> 0xc & 0xfff;
      uVar3 = *(ulong *)((long)in + 0xc);
      out[7] = uVar2 & 0xfff;
      out[8] = (uint)(uVar3 >> 0x14) & 0xfff;
      auVar8._8_8_ = 0;
      auVar8._0_8_ = uVar3;
      auVar7 = vpshufd_avx(auVar8,0x54);
      auVar9 = vpsrlvd_avx2(auVar7,auVar4);
      auVar8 = vpinsrd_avx(auVar6,((uint)uVar3 & 0xff) << 4,1);
      uVar2 = *(uint *)((long)in + 0x14);
      auVar7 = vpand_avx(auVar9,auVar6);
      auVar8 = vpor_avx(auVar9,auVar8);
      auVar7 = vpblendd_avx2(auVar7,auVar8,2);
      *(undefined1 (*) [16])(out + 9) = auVar7;
      out[0xd] = ((uint)(uVar3 >> 0x20) & 0xf) << 8 | uVar2 >> 0x18;
      out[0xe] = uVar2 >> 0xc & 0xfff;
      uVar3 = *(ulong *)((long)in + 0x18);
      out[0xf] = uVar2 & 0xfff;
      out[0x10] = (uint)(uVar3 >> 0x14) & 0xfff;
      auVar9._8_8_ = 0;
      auVar9._0_8_ = uVar3;
      auVar7 = vpshufd_avx(auVar9,0x54);
      auVar9 = vpsrlvd_avx2(auVar7,auVar4);
      auVar8 = vpinsrd_avx(auVar6,((uint)uVar3 & 0xff) << 4,1);
      uVar2 = (uint)*(ulong *)((long)in + 0x20);
      auVar7 = vpand_avx(auVar9,auVar6);
      auVar8 = vpor_avx(auVar9,auVar8);
      auVar7 = vpblendd_avx2(auVar7,auVar8,2);
      *(undefined1 (*) [16])(out + 0x11) = auVar7;
      out[0x15] = ((uint)(uVar3 >> 0x20) & 0xf) << 8 | uVar2 >> 0x18;
      out[0x16] = uVar2 >> 0xc & 0xfff;
      uVar3 = *(ulong *)((long)in + 0x24);
      out[0x17] = uVar2 & 0xfff;
      in = (uint32_t *)((long)in + 0x30);
      auVar10._8_8_ = 0;
      auVar10._0_8_ = uVar3;
      auVar7 = vpshufd_avx(auVar10,0x54);
      out[0x18] = (uint)(uVar3 >> 0x14) & 0xfff;
      auVar9 = vpsrlvd_avx2(auVar7,auVar4);
      auVar8 = vpinsrd_avx(auVar6,((uint)uVar3 & 0xff) << 4,1);
      auVar7 = vpand_avx(auVar9,auVar6);
      auVar8 = vpor_avx(auVar9,auVar8);
      auVar7 = vpblendd_avx2(auVar7,auVar8,2);
      *(undefined1 (*) [16])(out + 0x19) = auVar7;
      out[0x1d] = ((uint)(uVar3 >> 0x20) & 0xf) << 8 | uVar1 >> 0x18;
      out[0x1e] = uVar1 >> 0xc & 0xfff;
      out[0x1f] = uVar1 & 0xfff;
      out = out + 0x20;
      uVar5 = uVar5 - 1;
    } while (uVar5 != 0);
  }
  return;
}

Assistant:

void __vseblocks_unpack12(uint32_t *__restrict__ out,
                          const uint32_t *__restrict__ in, uint32_t bs) {
  for (bs = (bs + 31U) / 32U; bs > 0; out += 32, in += 12, --bs) {
    out[0] = in[0] >> 20;
    out[1] = (in[0] >> 8) & 0x0fff;
    out[2] = (in[0] << 4) & 0x0fff;
    out[2] |= in[1] >> 28;
    out[3] = (in[1] >> 16) & 0x0fff;
    out[4] = (in[1] >> 4) & 0x0fff;
    out[5] = (in[1] << 8) & 0x0fff;
    out[5] |= in[2] >> 24;
    out[6] = (in[2] >> 12) & 0x0fff;
    out[7] = in[2] & 0x0fff;
    out[8] = in[3] >> 20;
    out[9] = (in[3] >> 8) & 0x0fff;
    out[10] = (in[3] << 4) & 0x0fff;
    out[10] |= in[4] >> 28;
    out[11] = (in[4] >> 16) & 0x0fff;
    out[12] = (in[4] >> 4) & 0x0fff;
    out[13] = (in[4] << 8) & 0x0fff;
    out[13] |= in[5] >> 24;
    out[14] = (in[5] >> 12) & 0x0fff;
    out[15] = in[5] & 0x0fff;
    out[16] = in[6] >> 20;
    out[17] = (in[6] >> 8) & 0x0fff;
    out[18] = (in[6] << 4) & 0x0fff;
    out[18] |= in[7] >> 28;
    out[19] = (in[7] >> 16) & 0x0fff;
    out[20] = (in[7] >> 4) & 0x0fff;
    out[21] = (in[7] << 8) & 0x0fff;
    out[21] |= in[8] >> 24;
    out[22] = (in[8] >> 12) & 0x0fff;
    out[23] = in[8] & 0x0fff;
    out[24] = in[9] >> 20;
    out[25] = (in[9] >> 8) & 0x0fff;
    out[26] = (in[9] << 4) & 0x0fff;
    out[26] |= in[10] >> 28;
    out[27] = (in[10] >> 16) & 0x0fff;
    out[28] = (in[10] >> 4) & 0x0fff;
    out[29] = (in[10] << 8) & 0x0fff;
    out[29] |= in[11] >> 24;
    out[30] = (in[11] >> 12) & 0x0fff;
    out[31] = in[11] & 0x0fff;
  }
}